

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O1

double __thiscall ON_Annotation::AngleRoundOff(ON_Annotation *this,ON_DimStyle *parent_style)

{
  bool bVar1;
  double dVar2;
  
  if (this->m_override_dimstyle != (ON_DimStyle *)0x0) {
    bVar1 = ON_DimStyle::IsFieldOverride(this->m_override_dimstyle,AngularRound);
    if (bVar1) {
      parent_style = this->m_override_dimstyle;
      goto LAB_003868a3;
    }
  }
  if ((parent_style == (ON_DimStyle *)0x0) &&
     (parent_style = this->m_override_dimstyle, parent_style == (ON_DimStyle *)0x0)) {
    parent_style = &ON_DimStyle::Default;
  }
LAB_003868a3:
  dVar2 = ON_DimStyle::AngleRoundOff(parent_style);
  return dVar2;
}

Assistant:

double ON_Annotation::AngleRoundOff(const ON_DimStyle* parent_style) const
{
  return Internal_StyleForFieldQuery(parent_style,ON_DimStyle::field::AngularRound).AngleRoundOff();
}